

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

xmlNodePtr get_api_root(void)

{
  if ((((api_root == (xmlNodePtr)0x0) || (api_root->type != XML_ELEMENT_NODE)) &&
      (get_api_doc(), api_doc != (xmlDocPtr)0x0)) &&
     (((api_doc->children != (_xmlNode *)0x0 && (api_doc->children->next != (_xmlNode *)0x0)) &&
      (api_doc->children->next->type == XML_ELEMENT_NODE)))) {
    api_root = api_doc->children->next;
  }
  return api_root;
}

Assistant:

static xmlNodePtr
get_api_root(void) {
    if ((api_root == NULL) || (api_root->type != XML_ELEMENT_NODE)) {
        get_api_doc();
	if ((api_doc != NULL) && (api_doc->children != NULL) &&
	    (api_doc->children->next != NULL) &&
	    (api_doc->children->next->type == XML_ELEMENT_NODE))
	    api_root = api_doc->children->next;
    }
    return(api_root);
}